

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::~call_matcher
          (call_matcher<void_(),_std::tuple<>_> *this)

{
  bool bVar1;
  char *in_RSI;
  undefined1 local_20 [8];
  unique_lock<std::recursive_mutex> lock;
  call_matcher<void_(),_std::tuple<>_> *this_local;
  
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__call_matcher_0024cd88;
  (this->super_expectation)._vptr_expectation = (_func_int **)&DAT_0024cdf0;
  lock._8_8_ = this;
  get_lock<void>();
  bVar1 = is_unfulfilled(this);
  if (bVar1) {
    in_RSI = "Unfulfilled expectation";
    report_missed(this,"Unfulfilled expectation");
  }
  list_elem<trompeloeil::call_matcher_base<void_()>_>::unlink
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this,in_RSI);
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_20);
  Catch::clara::std::
  unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
  ::~unique_ptr(&this->sequences);
  Catch::clara::std::
  unique_ptr<trompeloeil::return_handler<void_()>,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  ::~unique_ptr(&this->return_handler_obj);
  list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->actions);
  list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->conditions)
  ;
  expectation::~expectation(&this->super_expectation);
  call_matcher_base<void_()>::~call_matcher_base(&this->super_call_matcher_base<void_()>);
  return;
}

Assistant:

~call_matcher() override
    {
      auto lock = get_lock();
      if (is_unfulfilled())
      {
        report_missed("Unfulfilled expectation");
      }
      this->unlink();
    }